

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight.cpp
# Opt level: O0

ostream * operator<<(ostream *out,User *usr)

{
  ostream *poVar1;
  string local_68;
  string local_38;
  User *local_18;
  User *usr_local;
  ostream *out_local;
  
  local_18 = usr;
  usr_local = (User *)out;
  poVar1 = std::operator<<(out,"My name is ");
  User::first_name_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," ");
  User::last_name_abi_cxx11_(&local_68,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const User& usr)
	{
		return out << "My name is " << usr.first_name() << " " << usr.last_name();
	}